

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O2

int xmlSchematronUnregisterVariables
              (xmlSchematronValidCtxtPtr vctxt,xmlXPathContextPtr_conflict ctxt,
              xmlSchematronLetPtr_conflict let)

{
  int iVar1;
  xmlChar *str1;
  char *msg;
  
  while( true ) {
    if (let == (xmlSchematronLetPtr_conflict)0x0) {
      return 0;
    }
    str1 = (xmlChar *)0x0;
    iVar1 = xmlXPathRegisterVariableNS(ctxt,let->name,(xmlChar *)0x0,(xmlXPathObjectPtr)0x0);
    if (iVar1 != 0) break;
    let = let->next;
  }
  xmlSchematronVErr(vctxt,0x1d8f93,msg,str1);
  return -1;
}

Assistant:

static int
xmlSchematronUnregisterVariables(xmlSchematronValidCtxtPtr vctxt,
                                 xmlXPathContextPtr ctxt,
                                 xmlSchematronLetPtr let)
{
    while (let != NULL) {
        if (xmlXPathRegisterVariableNS(ctxt, let->name, NULL, NULL)) {
            xmlSchematronVErr(vctxt, XML_ERR_INTERNAL_ERROR,
                              "Unregistering a let variable failed\n", NULL);
            return -1;
        }
        let = let->next;
    }
    return 0;
}